

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O3

uint8_t get_superres_denom_for_qindex(AV1_COMP *cpi,int qindex,int sr_kf,int sr_arf)

{
  FRAME_UPDATE_TYPE FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  AV1_PRIMARY *pAVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  byte bVar8;
  int k;
  long lVar9;
  byte bVar10;
  uint8_t *puVar11;
  double *pdVar12;
  int iVar13;
  YV12_BUFFER_CONFIG *buf;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  int bd;
  double energy [16];
  int32_t coeff [64];
  long local_238 [14];
  double local_1c8 [18];
  int32_t local_138;
  int aiStack_134 [16];
  int aiStack_f4 [16];
  int aiStack_b4 [16];
  int aiStack_74 [17];
  
  pAVar6 = cpi->ppi;
  FVar1 = (pAVar6->gf_group).update_type[cpi->gf_frame_index];
  if ((FVar1 != '\x03') && (FVar1 != '\0')) {
    return '\b';
  }
  iVar2 = (cpi->td).mb.e_mbd.bd;
  pYVar7 = cpi->source;
  iVar3 = (pYVar7->field_2).field_0.y_crop_width;
  iVar4 = (pYVar7->field_3).field_0.y_crop_height;
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  local_238[4] = 0;
  local_238[5] = 0;
  local_238[6] = 0;
  local_238[7] = 0;
  local_238[8] = 0;
  local_238[9] = 0;
  local_238[10] = 0;
  local_238[0xb] = 0;
  local_238[0xc] = 0;
  local_238[0xd] = 0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  if ((pYVar7->flags & 8) == 0) {
    iVar17 = 0;
    if (4 < iVar4) {
      uVar16 = 0;
      iVar17 = 0;
      do {
        if (0x10 < iVar3) {
          lVar18 = 0;
          do {
            lVar9 = (long)(pYVar7->field_4).field_0.y_stride;
            puVar11 = (pYVar7->field_5).buffers[0] + uVar16 * lVar9 + lVar18;
            lVar14 = 0;
            pdVar12 = local_1c8 + 2;
            do {
              lVar15 = 0;
              do {
                *(ushort *)((long)pdVar12 + lVar15 * 2) = (ushort)puVar11[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 0x10);
              lVar14 = lVar14 + 1;
              pdVar12 = pdVar12 + 4;
              puVar11 = puVar11 + lVar9;
            } while (lVar14 != 4);
            (*av1_fwd_txfm2d_16x4)((int16_t *)(local_1c8 + 2),&local_138,0x10,'\v',iVar2);
            lVar9 = 0;
            do {
              local_238[lVar9 + 1] =
                   local_238[lVar9 + 1] +
                   ((long)aiStack_b4[lVar9] * (long)aiStack_b4[lVar9] +
                    (long)aiStack_f4[lVar9] * (long)aiStack_f4[lVar9] +
                    (long)aiStack_134[lVar9] * (long)aiStack_134[lVar9] +
                    (long)aiStack_74[lVar9] * (long)aiStack_74[lVar9] + 2U >> 2);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0xf);
            iVar17 = iVar17 + 1;
            lVar18 = lVar18 + 0x10;
          } while (lVar18 < (long)iVar3 + -0x10);
        }
        uVar16 = uVar16 + 4;
      } while (uVar16 < iVar4 - 4);
    }
LAB_00229ef3:
    if (iVar17 != 0) {
      lVar18 = 1;
      do {
        local_1c8[lVar18 + 2] =
             (((double)CONCAT44(0x45300000,(int)((ulong)local_238[lVar18] >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_238[lVar18]) - 4503599627370496.0)) /
             (double)iVar17;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      uVar16 = 0xf;
      do {
        local_1c8[0x11] = local_1c8[0x11] + local_1c8[uVar16 + 1];
        local_1c8[uVar16 + 1] = local_1c8[0x11];
        uVar16 = uVar16 - 1;
      } while (1 < uVar16);
      goto LAB_00229ffa;
    }
  }
  else if (4 < iVar4) {
    puVar11 = (pYVar7->field_5).field_0.y_buffer;
    bVar8 = (char)iVar2 * '\x02' - 0xe;
    iVar17 = 0;
    iVar13 = 0;
    do {
      if (0x10 < iVar3) {
        lVar18 = 0;
        do {
          iVar5 = (pYVar7->field_4).field_0.y_stride;
          (*av1_fwd_txfm2d_16x4)
                    ((int16_t *)((long)puVar11 * 2 + (long)(iVar5 * iVar13) * 2 + lVar18 * 2),
                     &local_138,iVar5,'\v',iVar2);
          lVar9 = 0;
          do {
            local_238[lVar9 + 1] =
                 local_238[lVar9 + 1] +
                 ((long)aiStack_74[lVar9] * (long)aiStack_74[lVar9] +
                  (long)aiStack_b4[lVar9] * (long)aiStack_b4[lVar9] +
                  (long)aiStack_f4[lVar9] * (long)aiStack_f4[lVar9] +
                  (long)aiStack_134[lVar9] * (long)aiStack_134[lVar9] +
                  (ulong)((uint)(1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x3f));
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0xf);
          iVar17 = iVar17 + 1;
          lVar18 = lVar18 + 0x10;
        } while ((int)lVar18 < iVar3 + -0x10);
      }
      iVar13 = iVar13 + 4;
    } while (iVar13 < iVar4 + -4);
    goto LAB_00229ef3;
  }
  lVar18 = 0;
  do {
    auVar21._8_4_ = (int)lVar18;
    auVar21._0_8_ = lVar18;
    auVar21._12_4_ = (int)((ulong)lVar18 >> 0x20);
    auVar21 = (auVar21 | _DAT_004c83b0) ^ _DAT_004c83c0;
    if (auVar21._4_4_ == -0x80000000 && auVar21._0_4_ < -0x7ffffff1) {
      local_1c8[lVar18 + 3] = 1e+20;
      local_1c8[lVar18 + 4] = 1e+20;
    }
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x10);
LAB_00229ffa:
  FVar1 = (pAVar6->gf_group).update_type[cpi->gf_frame_index];
  if (FVar1 == '\x03') {
    dVar19 = 0.008;
  }
  else if (FVar1 == '\0') {
    dVar19 = *(double *)(&DAT_00502670 + (ulong)((cpi->rc).frames_to_key < 2) * 8);
  }
  else {
    dVar19 = 0.0;
  }
  dVar20 = av1_convert_qindex_to_q(qindex,AOM_BITS_8);
  dVar20 = dVar19 * dVar20 * dVar20;
  if (local_1c8[3] * 0.2 <= dVar20) {
    dVar20 = local_1c8[3] * 0.2;
  }
  bVar8 = 8;
  uVar16 = 0x11;
  do {
    if (dVar20 < local_1c8[uVar16]) goto LAB_0022a094;
    bVar8 = bVar8 + 1;
    uVar16 = uVar16 - 1;
  } while (9 < uVar16);
  bVar8 = 0x10;
LAB_0022a094:
  if (((cpi->oxcf).superres_cfg.superres_mode == AOM_SUPERRES_AUTO) &&
     ((cpi->sf).hl_sf.superres_auto_search_type != '\x02')) {
    bVar10 = 9;
    if (9 < bVar8) {
      bVar10 = bVar8;
    }
    if (1 < (cpi->rc).frames_to_key) {
      bVar8 = bVar10;
    }
  }
  return bVar8;
}

Assistant:

static uint8_t get_superres_denom_for_qindex(const AV1_COMP *cpi, int qindex,
                                             int sr_kf, int sr_arf) {
  // Use superres for Key-frames and Alt-ref frames only.
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->update_type[cpi->gf_frame_index] != ARF_UPDATE) {
    return SCALE_NUMERATOR;
  }
  if (gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE && !sr_kf) {
    return SCALE_NUMERATOR;
  }
  if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE && !sr_arf) {
    return SCALE_NUMERATOR;
  }

  double energy[16];
  analyze_hor_freq(cpi, energy);

  const double energy_by_q2_thresh =
      get_energy_by_q2_thresh(gf_group, &cpi->rc, cpi->gf_frame_index);
  int denom = get_superres_denom_from_qindex_energy(
      qindex, energy, energy_by_q2_thresh, SUPERRES_ENERGY_BY_AC_THRESH);
  /*
  printf("\nenergy = [");
  for (int k = 1; k < 16; ++k) printf("%f, ", energy[k]);
  printf("]\n");
  printf("boost = %d\n",
         (gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE)
             ? cpi->ppi->p_rc.kf_boost
             : cpi->rc.gfu_boost);
  printf("denom = %d\n", denom);
  */
  if (av1_superres_in_recode_allowed(cpi)) {
    assert(cpi->superres_mode != AOM_SUPERRES_NONE);
    // Force superres to be tried in the recode loop, as full-res is also going
    // to be tried anyway.
    denom = AOMMAX(denom, SCALE_NUMERATOR + 1);
  }
  return denom;
}